

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O3

int cubeb_enumerate_devices
              (cubeb *context,cubeb_device_type devtype,cubeb_device_collection *collection)

{
  undefined4 *puVar1;
  int iVar2;
  uint uVar3;
  _func_int_cubeb_ptr_cubeb_device_type_cubeb_device_collection_ptr *p_Var4;
  cubeb_device_info *pcVar5;
  int iVar6;
  cubeb_log_level cVar7;
  cubeb_log_callback p_Var8;
  ulong uVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  char local_b8 [136];
  
  iVar6 = -3;
  if (((devtype & (CUBEB_DEVICE_TYPE_OUTPUT|CUBEB_DEVICE_TYPE_INPUT)) != CUBEB_DEVICE_TYPE_UNKNOWN)
     && (collection != (cubeb_device_collection *)0x0 && context != (cubeb *)0x0)) {
    p_Var4 = context->ops->enumerate_devices;
    if (p_Var4 == (_func_int_cubeb_ptr_cubeb_device_type_cubeb_device_collection_ptr *)0x0) {
      iVar6 = -4;
    }
    else {
      iVar6 = (*p_Var4)(context,devtype,collection);
      p_Var8 = cubeb_log_get_callback();
      if ((p_Var8 != (cubeb_log_callback)0x0) && (collection->count != 0)) {
        lVar14 = 0x50;
        uVar15 = 0;
        do {
          pcVar5 = collection->device;
          local_b8[0x70] = '\0';
          local_b8[0x71] = '\0';
          local_b8[0x72] = '\0';
          local_b8[0x73] = '\0';
          local_b8[0x74] = '\0';
          local_b8[0x75] = '\0';
          local_b8[0x76] = '\0';
          local_b8[0x77] = '\0';
          local_b8[0x78] = '\0';
          local_b8[0x79] = '\0';
          local_b8[0x7a] = '\0';
          local_b8[0x7b] = '\0';
          local_b8[0x7c] = '\0';
          local_b8[0x7d] = '\0';
          local_b8[0x7e] = '\0';
          local_b8[0x7f] = '\0';
          local_b8[0x60] = '\0';
          local_b8[0x61] = '\0';
          local_b8[0x62] = '\0';
          local_b8[99] = '\0';
          local_b8[100] = '\0';
          local_b8[0x65] = '\0';
          local_b8[0x66] = '\0';
          local_b8[0x67] = '\0';
          local_b8[0x68] = '\0';
          local_b8[0x69] = '\0';
          local_b8[0x6a] = '\0';
          local_b8[0x6b] = '\0';
          local_b8[0x6c] = '\0';
          local_b8[0x6d] = '\0';
          local_b8[0x6e] = '\0';
          local_b8[0x6f] = '\0';
          local_b8[0x50] = '\0';
          local_b8[0x51] = '\0';
          local_b8[0x52] = '\0';
          local_b8[0x53] = '\0';
          local_b8[0x54] = '\0';
          local_b8[0x55] = '\0';
          local_b8[0x56] = '\0';
          local_b8[0x57] = '\0';
          local_b8[0x58] = '\0';
          local_b8[0x59] = '\0';
          local_b8[0x5a] = '\0';
          local_b8[0x5b] = '\0';
          local_b8[0x5c] = '\0';
          local_b8[0x5d] = '\0';
          local_b8[0x5e] = '\0';
          local_b8[0x5f] = '\0';
          local_b8[0x40] = '\0';
          local_b8[0x41] = '\0';
          local_b8[0x42] = '\0';
          local_b8[0x43] = '\0';
          local_b8[0x44] = '\0';
          local_b8[0x45] = '\0';
          local_b8[0x46] = '\0';
          local_b8[0x47] = '\0';
          local_b8[0x48] = '\0';
          local_b8[0x49] = '\0';
          local_b8[0x4a] = '\0';
          local_b8[0x4b] = '\0';
          local_b8[0x4c] = '\0';
          local_b8[0x4d] = '\0';
          local_b8[0x4e] = '\0';
          local_b8[0x4f] = '\0';
          local_b8[0x30] = '\0';
          local_b8[0x31] = '\0';
          local_b8[0x32] = '\0';
          local_b8[0x33] = '\0';
          local_b8[0x34] = '\0';
          local_b8[0x35] = '\0';
          local_b8[0x36] = '\0';
          local_b8[0x37] = '\0';
          local_b8[0x38] = '\0';
          local_b8[0x39] = '\0';
          local_b8[0x3a] = '\0';
          local_b8[0x3b] = '\0';
          local_b8[0x3c] = '\0';
          local_b8[0x3d] = '\0';
          local_b8[0x3e] = '\0';
          local_b8[0x3f] = '\0';
          local_b8[0x20] = '\0';
          local_b8[0x21] = '\0';
          local_b8[0x22] = '\0';
          local_b8[0x23] = '\0';
          local_b8[0x24] = '\0';
          local_b8[0x25] = '\0';
          local_b8[0x26] = '\0';
          local_b8[0x27] = '\0';
          local_b8[0x28] = '\0';
          local_b8[0x29] = '\0';
          local_b8[0x2a] = '\0';
          local_b8[0x2b] = '\0';
          local_b8[0x2c] = '\0';
          local_b8[0x2d] = '\0';
          local_b8[0x2e] = '\0';
          local_b8[0x2f] = '\0';
          local_b8[0x10] = '\0';
          local_b8[0x11] = '\0';
          local_b8[0x12] = '\0';
          local_b8[0x13] = '\0';
          local_b8[0x14] = '\0';
          local_b8[0x15] = '\0';
          local_b8[0x16] = '\0';
          local_b8[0x17] = '\0';
          local_b8[0x18] = '\0';
          local_b8[0x19] = '\0';
          local_b8[0x1a] = '\0';
          local_b8[0x1b] = '\0';
          local_b8[0x1c] = '\0';
          local_b8[0x1d] = '\0';
          local_b8[0x1e] = '\0';
          local_b8[0x1f] = '\0';
          local_b8[0] = '\0';
          local_b8[1] = '\0';
          local_b8[2] = '\0';
          local_b8[3] = '\0';
          local_b8[4] = '\0';
          local_b8[5] = '\0';
          local_b8[6] = '\0';
          local_b8[7] = '\0';
          local_b8[8] = '\0';
          local_b8[9] = '\0';
          local_b8[10] = '\0';
          local_b8[0xb] = '\0';
          local_b8[0xc] = '\0';
          local_b8[0xd] = '\0';
          local_b8[0xe] = '\0';
          local_b8[0xf] = '\0';
          iVar2 = *(int *)((long)pcVar5 + lVar14 + -0x28);
          uVar9 = (ulong)*(uint *)((long)pcVar5 + lVar14 + -0x24);
          pcVar13 = "unknown?";
          pcVar16 = "unknown?";
          if (iVar2 == 2) {
            pcVar16 = "output";
          }
          if (iVar2 == 1) {
            pcVar16 = "input";
          }
          if (uVar9 < 3) {
            pcVar13 = &DAT_001489ac + *(int *)(&DAT_001489ac + uVar9 * 4);
          }
          iVar2 = *(int *)((long)pcVar5 + lVar14 + -0x18);
          if (iVar2 < 0x1000) {
            pcVar11 = "S16LE";
            if (iVar2 != 0x10) {
              if (iVar2 == 0x20) {
                pcVar11 = "S16BE";
              }
              else {
LAB_00112177:
                pcVar11 = "unknown?";
              }
            }
          }
          else if (iVar2 == 0x1000) {
            pcVar11 = "F32LE";
          }
          else {
            if (iVar2 != 0x2000) goto LAB_00112177;
            pcVar11 = "F32BE";
          }
          uVar3 = *(uint *)((long)pcVar5 + lVar14 + -0x1c);
          if ((uVar3 & 0x10) != 0) {
            sVar10 = strlen(local_b8);
            builtin_strncpy(local_b8 + sVar10," S16LE",7);
          }
          if ((uVar3 & 0x20) != 0) {
            sVar10 = strlen(local_b8);
            builtin_strncpy(local_b8 + sVar10," S16BE",7);
          }
          if ((uVar3 >> 0xc & 1) != 0) {
            sVar10 = strlen(local_b8);
            builtin_strncpy(local_b8 + sVar10," F32LE",7);
          }
          if ((uVar3 >> 0xd & 1) != 0) {
            sVar10 = strlen(local_b8);
            builtin_strncpy(local_b8 + sVar10," F32BE",7);
          }
          cVar7 = cubeb_log_get_level();
          if ((cVar7 != CUBEB_LOG_DISABLED) &&
             (p_Var8 = cubeb_log_get_callback(), p_Var8 != (cubeb_log_callback)0x0)) {
            pcVar12 = " (PREFERRED)";
            if (*(int *)((long)pcVar5 + lVar14 + -0x20) == 0) {
              pcVar12 = "";
            }
            puVar1 = (undefined4 *)((long)pcVar5 + lVar14 + -0x38);
            cubeb_log_internal("cubeb.c",0x29e,
                               "DeviceID: \"%s\"%s\n\tName:\t\"%s\"\n\tGroup:\t\"%s\"\n\tVendor:\t\"%s\"\n\tType:\t%s\n\tState:\t%s\n\tMaximum channels:\t%u\n\tFormat:\t%s (0x%x) (default: %s)\n\tRate:\t[%u, %u] (default: %u)\n\tLatency: lo %u frames, hi %u frames"
                               ,*(undefined8 *)((long)pcVar5 + lVar14 + -0x48),pcVar12,
                               *(undefined8 *)((long)pcVar5 + lVar14 + -0x40),*puVar1,puVar1[2],
                               pcVar16,pcVar13,*(undefined4 *)((long)pcVar5 + lVar14 + -0x14),
                               local_b8 + (local_b8[0] != '\0'),
                               *(undefined4 *)((long)pcVar5 + lVar14 + -0x1c),pcVar11,
                               *(undefined4 *)((long)pcVar5 + lVar14 + -8),
                               *(undefined4 *)((long)pcVar5 + lVar14 + -0xc),
                               *(undefined4 *)((long)pcVar5 + lVar14 + -0x10),
                               *(undefined4 *)((long)pcVar5 + lVar14 + -4),
                               *(undefined4 *)((long)&pcVar5->devid + lVar14));
          }
          uVar15 = uVar15 + 1;
          lVar14 = lVar14 + 0x58;
        } while (uVar15 < collection->count);
      }
    }
  }
  return iVar6;
}

Assistant:

int
cubeb_enumerate_devices(cubeb * context, cubeb_device_type devtype,
                        cubeb_device_collection * collection)
{
  int rv;
  if ((devtype & (CUBEB_DEVICE_TYPE_INPUT | CUBEB_DEVICE_TYPE_OUTPUT)) == 0)
    return CUBEB_ERROR_INVALID_PARAMETER;
  if (context == NULL || collection == NULL)
    return CUBEB_ERROR_INVALID_PARAMETER;
  if (!context->ops->enumerate_devices)
    return CUBEB_ERROR_NOT_SUPPORTED;

  rv = context->ops->enumerate_devices(context, devtype, collection);

  if (cubeb_log_get_callback()) {
    for (size_t i = 0; i < collection->count; i++) {
      log_device(&collection->device[i]);
    }
  }

  return rv;
}